

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decFactor.c
# Opt level: O0

Dec_Graph_t * Dec_Factor(char *pSop)

{
  int iVar1;
  Dec_Edge_t eRoot_00;
  Mvc_Cover_t *pCover_00;
  Dec_Edge_t eRoot;
  Dec_Graph_t *pFForm;
  Mvc_Cover_t *pCover;
  char *pSop_local;
  
  iVar1 = Abc_SopIsConst0(pSop);
  if (iVar1 == 0) {
    iVar1 = Abc_SopIsConst1(pSop);
    if (iVar1 == 0) {
      pCover_00 = Dec_ConvertSopToMvc(pSop);
      Mvc_CoverContain(pCover_00);
      iVar1 = Mvc_CoverIsEmpty(pCover_00);
      if (iVar1 != 0) {
        __assert_fail("!Mvc_CoverIsEmpty(pCover)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/dec/decFactor.c"
                      ,0x4b,"Dec_Graph_t *Dec_Factor(char *)");
      }
      iVar1 = Mvc_CoverIsTautology(pCover_00);
      if (iVar1 != 0) {
        __assert_fail("!Mvc_CoverIsTautology(pCover)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/dec/decFactor.c"
                      ,0x4c,"Dec_Graph_t *Dec_Factor(char *)");
      }
      Mvc_CoverInverse(pCover_00);
      iVar1 = Abc_SopGetVarNum(pSop);
      pSop_local = (char *)Dec_GraphCreate(iVar1);
      eRoot_00 = Dec_Factor_rec((Dec_Graph_t *)pSop_local,pCover_00);
      Dec_GraphSetRoot((Dec_Graph_t *)pSop_local,eRoot_00);
      iVar1 = Abc_SopIsComplement(pSop);
      if (iVar1 != 0) {
        Dec_GraphComplement((Dec_Graph_t *)pSop_local);
      }
      Mvc_CoverFree(pCover_00);
    }
    else {
      pSop_local = (char *)Dec_GraphCreateConst1();
    }
  }
  else {
    pSop_local = (char *)Dec_GraphCreateConst0();
  }
  return (Dec_Graph_t *)pSop_local;
}

Assistant:

Dec_Graph_t * Dec_Factor( char * pSop )
{
    Mvc_Cover_t * pCover;
    Dec_Graph_t * pFForm;
    Dec_Edge_t eRoot;
    if ( Abc_SopIsConst0(pSop) )
        return Dec_GraphCreateConst0();
    if ( Abc_SopIsConst1(pSop) )
        return Dec_GraphCreateConst1();

    // derive the cover from the SOP representation
    pCover = Dec_ConvertSopToMvc( pSop );

    // make sure the cover is CCS free (should be done before CST)
    Mvc_CoverContain( pCover );

    // check for trivial functions
    assert( !Mvc_CoverIsEmpty(pCover) );
    assert( !Mvc_CoverIsTautology(pCover) );

    // perform CST
    Mvc_CoverInverse( pCover ); // CST
    // start the factored form
    pFForm = Dec_GraphCreate( Abc_SopGetVarNum(pSop) );
    // factor the cover
    eRoot = Dec_Factor_rec( pFForm, pCover );
    // finalize the factored form
    Dec_GraphSetRoot( pFForm, eRoot );
    // complement the factored form if SOP is complemented
    if ( Abc_SopIsComplement(pSop) )
        Dec_GraphComplement( pFForm );
    // verify the factored form
//    if ( !Dec_FactorVerify( pSop, pFForm ) )
//        printf( "Verification has failed.\n" );
//    Mvc_CoverInverse( pCover ); // undo CST
    Mvc_CoverFree( pCover );
    return pFForm;
}